

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateGRULayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  pointer pcVar1;
  long lVar2;
  void *pvVar3;
  uint uVar4;
  bool bVar5;
  WeightParamType *wt;
  undefined1 *puVar6;
  pointer pWVar7;
  long *plVar8;
  size_type *psVar9;
  int iVar10;
  Result *_result;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint64_t uVar15;
  long lVar16;
  undefined1 *puVar17;
  InternalMetadata *pIVar18;
  LayerUnion LVar19;
  long lVar20;
  string err;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> weightTypeList;
  string local_c8;
  string local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  char local_79;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> local_78;
  LayerUnion local_60;
  uint64_t local_58;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  pcVar1 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar11 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar11) {
    operator_delete(pcVar1,paVar11->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,2,2);
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  pcVar1 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar11) {
    operator_delete(pcVar1,paVar11->_M_allocated_capacity + 1);
  }
  if (this->ndArrayInterpretation == true) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"GRU","");
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good(__return_storage_ptr__);
    if (!bVar5) {
      return __return_storage_ptr__;
    }
    pcVar1 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != paVar11) {
      operator_delete(pcVar1,paVar11->_M_allocated_capacity + 1);
    }
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"GRU","");
    validateRankCount(__return_storage_ptr__,layer,&local_c8,5,5,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good(__return_storage_ptr__);
    if (!bVar5) {
      return __return_storage_ptr__;
    }
    pcVar1 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != paVar11) {
      operator_delete(pcVar1,paVar11->_M_allocated_capacity + 1);
    }
  }
  if (layer->_oneof_case_[0] == 0x19a) {
    puVar17 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar17 = Specification::_GRULayerParams_default_instance_;
  }
  bVar5 = ((GRULayerParams *)puVar17)->hasbiasvectors_;
  local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_start = (WeightParamType *)0x0;
  local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (WeightParamType *)0x0;
  local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (WeightParamType *)0x0;
  puVar6 = (undefined1 *)((BatchnormLayerParams *)puVar17)->variance_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  iVar10 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
  lVar20 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                     0xfffffffffffffffe) + 8);
  uVar14 = (0 < iVar10) + 1;
  if (lVar20 == 0) {
    uVar14 = (uint)(0 < iVar10);
  }
  lVar16 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                     0xfffffffffffffffe) + 8);
  lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar4 = (uint)(lVar2 == 0);
  uVar14 = (uVar14 - (lVar16 == 0)) + 2;
  uVar12 = 4;
  if (uVar14 - uVar4 < 2) {
    uVar12 = 5;
    if (uVar14 != uVar4) {
      uVar12 = (uint)(iVar10 < 1);
    }
    if (((((lVar20 == 0) && (uVar14 != uVar4)) && (iVar10 < 1)) &&
        (((lVar16 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (uVar12 = 2, ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar2 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
        (uVar12 = 3, ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
      uVar12 = 5;
    }
  }
  local_c8._M_dataplus._M_p._0_4_ = uVar12;
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  _M_realloc_insert<CoreML::WeightParamType>(&local_78,(iterator)0x0,(WeightParamType *)&local_c8);
  puVar6 = (undefined1 *)((ScaleLayerParams *)puVar17)->scale_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  iVar10 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
  lVar20 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                     0xfffffffffffffffe) + 8);
  uVar14 = (0 < iVar10) + 1;
  if (lVar20 == 0) {
    uVar14 = (uint)(0 < iVar10);
  }
  lVar16 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                     0xfffffffffffffffe) + 8);
  lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar4 = (uint)(lVar2 == 0);
  uVar14 = (uVar14 - (lVar16 == 0)) + 2;
  local_c8._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar14 - uVar4 < 2) {
    local_c8._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar14 != uVar4) {
      local_c8._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if ((((lVar20 == 0) && (uVar14 != uVar4)) && (iVar10 < 1)) &&
       ((((lVar16 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (local_c8._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)) &&
        (((lVar2 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (local_c8._M_dataplus._M_p._0_4_ = QINT,
         ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))))) {
      local_c8._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_78,
               (iterator)
               local_78.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_c8);
  }
  else {
    *local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_c8._M_dataplus._M_p;
    local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_78.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar6 = (undefined1 *)((GRULayerParams *)puVar17)->resetgateweightmatrix_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  iVar10 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
  lVar20 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                     0xfffffffffffffffe) + 8);
  uVar14 = (0 < iVar10) + 1;
  if (lVar20 == 0) {
    uVar14 = (uint)(0 < iVar10);
  }
  lVar16 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                     0xfffffffffffffffe) + 8);
  lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar4 = (uint)(lVar2 == 0);
  uVar14 = (uVar14 - (lVar16 == 0)) + 2;
  local_c8._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar14 - uVar4 < 2) {
    local_c8._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar14 != uVar4) {
      local_c8._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if (((((lVar20 == 0) && (uVar14 != uVar4)) && (iVar10 < 1)) &&
        (((lVar16 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (local_c8._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar2 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
        (local_c8._M_dataplus._M_p._0_4_ = QINT,
        ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
      local_c8._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_78,
               (iterator)
               local_78.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_c8);
  }
  else {
    *local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_c8._M_dataplus._M_p;
    local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_78.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar6 = (undefined1 *)((ScaleLayerParams *)puVar17)->bias_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  iVar10 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
  lVar20 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                     0xfffffffffffffffe) + 8);
  uVar14 = (0 < iVar10) + 1;
  if (lVar20 == 0) {
    uVar14 = (uint)(0 < iVar10);
  }
  lVar16 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                     0xfffffffffffffffe) + 8);
  lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar4 = (uint)(lVar2 == 0);
  uVar14 = (uVar14 - (lVar16 == 0)) + 2;
  local_c8._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar14 - uVar4 < 2) {
    local_c8._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar14 != uVar4) {
      local_c8._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if (((((lVar20 == 0) && (uVar14 != uVar4)) && (iVar10 < 1)) &&
        (((lVar16 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (local_c8._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar2 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
        (local_c8._M_dataplus._M_p._0_4_ = QINT,
        ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
      local_c8._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_78,
               (iterator)
               local_78.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_c8);
  }
  else {
    *local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_c8._M_dataplus._M_p;
    local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_78.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar6 = (undefined1 *)((GRULayerParams *)puVar17)->outputgateweightmatrix_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  iVar10 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
  lVar20 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                     0xfffffffffffffffe) + 8);
  uVar14 = (0 < iVar10) + 1;
  if (lVar20 == 0) {
    uVar14 = (uint)(0 < iVar10);
  }
  lVar16 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                     0xfffffffffffffffe) + 8);
  lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar4 = (uint)(lVar2 == 0);
  uVar14 = (uVar14 - (lVar16 == 0)) + 2;
  local_c8._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar14 - uVar4 < 2) {
    local_c8._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar14 != uVar4) {
      local_c8._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if (((((lVar20 == 0) && (uVar14 != uVar4)) && (iVar10 < 1)) &&
        (((lVar16 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (local_c8._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar2 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
        (local_c8._M_dataplus._M_p._0_4_ = QINT,
        ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
      local_c8._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_78,
               (iterator)
               local_78.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_c8);
  }
  else {
    *local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_c8._M_dataplus._M_p;
    local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_78.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar6 = (undefined1 *)((GRULayerParams *)puVar17)->outputgaterecursionmatrix_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  iVar10 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
  lVar20 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                     0xfffffffffffffffe) + 8);
  uVar14 = (0 < iVar10) + 1;
  if (lVar20 == 0) {
    uVar14 = (uint)(0 < iVar10);
  }
  lVar16 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                     0xfffffffffffffffe) + 8);
  lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar4 = (uint)(lVar2 == 0);
  uVar14 = (uVar14 - (lVar16 == 0)) + 2;
  local_c8._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar14 - uVar4 < 2) {
    local_c8._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar14 != uVar4) {
      local_c8._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if (((((lVar20 == 0) && (uVar14 != uVar4)) && (iVar10 < 1)) &&
        (((lVar16 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
         (local_c8._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar2 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
        (local_c8._M_dataplus._M_p._0_4_ = QINT,
        ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
      local_c8._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_78,
               (iterator)
               local_78.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_c8);
  }
  else {
    *local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_c8._M_dataplus._M_p;
    local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_78.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (bVar5 != false) {
    puVar6 = (undefined1 *)((GRULayerParams *)puVar17)->updategatebiasvector_;
    if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
      puVar6 = Specification::_WeightParams_default_instance_;
    }
    iVar10 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
    lVar20 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                       0xfffffffffffffffe) + 8);
    uVar14 = (0 < iVar10) + 1;
    if (lVar20 == 0) {
      uVar14 = (uint)(0 < iVar10);
    }
    lVar16 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                       0xfffffffffffffffe) + 8);
    lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar4 = (uint)(lVar2 == 0);
    uVar14 = (uVar14 - (lVar16 == 0)) + 2;
    local_c8._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar14 - uVar4 < 2) {
      local_c8._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar14 != uVar4) {
        local_c8._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
      }
      if (((((lVar20 == 0) && (uVar14 != uVar4)) && (iVar10 < 1)) &&
          (((lVar16 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
           (local_c8._M_dataplus._M_p._0_4_ = QUINT,
           ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
         (((lVar2 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
          (local_c8._M_dataplus._M_p._0_4_ = QINT,
          ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
        local_c8._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_78.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_78.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_78,
                 (iterator)
                 local_78.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_c8);
    }
    else {
      *local_78.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_c8._M_dataplus._M_p;
      local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    puVar6 = (undefined1 *)((GRULayerParams *)puVar17)->resetgatebiasvector_;
    if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
      puVar6 = Specification::_WeightParams_default_instance_;
    }
    iVar10 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
    lVar20 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                       0xfffffffffffffffe) + 8);
    uVar14 = (0 < iVar10) + 1;
    if (lVar20 == 0) {
      uVar14 = (uint)(0 < iVar10);
    }
    lVar16 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                       0xfffffffffffffffe) + 8);
    lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar4 = (uint)(lVar2 == 0);
    uVar14 = (uVar14 - (lVar16 == 0)) + 2;
    local_c8._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar14 - uVar4 < 2) {
      local_c8._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar14 != uVar4) {
        local_c8._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
      }
      if ((((lVar20 == 0) && (uVar14 != uVar4)) && (iVar10 < 1)) &&
         ((((lVar16 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
           (local_c8._M_dataplus._M_p._0_4_ = QUINT,
           ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)) &&
          (((lVar2 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
           (local_c8._M_dataplus._M_p._0_4_ = QINT,
           ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))))) {
        local_c8._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_78.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_78.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_78,
                 (iterator)
                 local_78.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_c8);
    }
    else {
      *local_78.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_c8._M_dataplus._M_p;
      local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    puVar6 = (undefined1 *)((GRULayerParams *)puVar17)->outputgatebiasvector_;
    if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
      puVar6 = Specification::_WeightParams_default_instance_;
    }
    iVar10 = (((WeightParams *)puVar6)->floatvalue_).current_size_;
    lVar20 = *(long *)(((ulong)(((WeightParams *)puVar6)->float16value_).tagged_ptr_.ptr_ &
                       0xfffffffffffffffe) + 8);
    uVar14 = (0 < iVar10) + 1;
    if (lVar20 == 0) {
      uVar14 = (uint)(0 < iVar10);
    }
    lVar16 = *(long *)(((ulong)(((WeightParams *)puVar6)->rawvalue_).tagged_ptr_.ptr_ &
                       0xfffffffffffffffe) + 8);
    lVar2 = *(long *)(((ulong)(((WeightParams *)puVar6)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar4 = (uint)(lVar2 == 0);
    uVar14 = (uVar14 - (lVar16 == 0)) + 2;
    local_c8._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar14 - uVar4 < 2) {
      local_c8._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar14 != uVar4) {
        local_c8._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
      }
      if (((((lVar20 == 0) && (uVar14 != uVar4)) && (iVar10 < 1)) &&
          (((lVar16 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
           (local_c8._M_dataplus._M_p._0_4_ = QUINT,
           ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) &&
         (((lVar2 == 0 || (puVar6 == Specification::_WeightParams_default_instance_)) ||
          (local_c8._M_dataplus._M_p._0_4_ = QINT,
          ((WeightParams *)puVar6)->quantization_ == (QuantizationParams *)0x0)))) {
        local_c8._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_78.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_78.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_78,
                 (iterator)
                 local_78.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_c8);
    }
    else {
      *local_78.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_c8._M_dataplus._M_p;
      local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar10 = 0;
    iVar13 = 0;
    pWVar7 = local_78.
             super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      if (*pWVar7 == FLOAT16) {
        iVar13 = iVar13 + 1;
      }
      else if (*pWVar7 == FLOAT32) {
        iVar10 = iVar10 + 1;
      }
      if (0 < iVar10 * iVar13) {
        std::operator+(&local_a8,"GRU layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_a8);
        psVar9 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_c8.field_2._M_allocated_capacity = *psVar9;
          local_c8.field_2._8_8_ = plVar8[3];
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar9;
          local_c8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_c8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_003414d1;
      }
      pWVar7 = pWVar7 + 1;
    } while (pWVar7 != local_78.
                       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  puVar6 = (undefined1 *)((BatchnormLayerParams *)puVar17)->variance_;
  local_58 = ((GRULayerParams *)puVar17)->outputvectorsize_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  uVar15 = ((GRULayerParams *)puVar17)->inputvectorsize_ * local_58;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_88 = paVar11;
  local_79 = bVar5;
  local_60 = (LayerUnion)puVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"GRU","");
  pvVar3 = (layer->name_).tagged_ptr_.ptr_;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"update gate weight matrix","");
  validateGeneralWeightParams
            (__return_storage_ptr__,(WeightParams *)puVar6,uVar15,local_58,&local_c8,
             (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_a8);
  paVar11 = local_88;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  bVar5 = Result::good(__return_storage_ptr__);
  if (bVar5) {
    plVar8 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar8 != paVar11) {
      operator_delete(plVar8,paVar11->_M_allocated_capacity + 1);
    }
    puVar17 = (undefined1 *)(local_60.gru_)->resetgateweightmatrix_;
    if ((WeightParams *)puVar17 == (WeightParams *)0x0) {
      puVar17 = Specification::_WeightParams_default_instance_;
    }
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"GRU","");
    pvVar3 = (layer->name_).tagged_ptr_.ptr_;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"reset gate weight matrix","");
    validateGeneralWeightParams
              (__return_storage_ptr__,(WeightParams *)puVar17,uVar15,local_58,&local_c8,
               (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_a8);
    paVar11 = local_88;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good(__return_storage_ptr__);
    if (bVar5) {
      plVar8 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar8 != paVar11) {
        operator_delete(plVar8,paVar11->_M_allocated_capacity + 1);
      }
      puVar17 = (undefined1 *)(local_60.gru_)->outputgateweightmatrix_;
      if ((WeightParams *)puVar17 == (WeightParams *)0x0) {
        puVar17 = Specification::_WeightParams_default_instance_;
      }
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"GRU","");
      pvVar3 = (layer->name_).tagged_ptr_.ptr_;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"output gate weight matrix","");
      validateGeneralWeightParams
                (__return_storage_ptr__,(WeightParams *)puVar17,uVar15,local_58,&local_c8,
                 (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_a8);
      paVar11 = local_88;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      bVar5 = Result::good(__return_storage_ptr__);
      if (bVar5) {
        plVar8 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar8 != paVar11) {
          operator_delete(plVar8,paVar11->_M_allocated_capacity + 1);
        }
        puVar17 = (undefined1 *)(local_60.scale_)->scale_;
        if ((WeightParams *)puVar17 == (WeightParams *)0x0) {
          puVar17 = Specification::_WeightParams_default_instance_;
        }
        uVar15 = (local_60.gru_)->outputvectorsize_;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"GRU","");
        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"update gate recursion matrix","");
        uVar15 = uVar15 * uVar15;
        validateGeneralWeightParams
                  (__return_storage_ptr__,(WeightParams *)puVar17,uVar15,local_58,&local_c8,
                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_a8);
        paVar11 = local_88;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        bVar5 = Result::good(__return_storage_ptr__);
        if (bVar5) {
          plVar8 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar8 != paVar11) {
            operator_delete(plVar8,paVar11->_M_allocated_capacity + 1);
          }
          puVar17 = (undefined1 *)(local_60.scale_)->bias_;
          if ((WeightParams *)puVar17 == (WeightParams *)0x0) {
            puVar17 = Specification::_WeightParams_default_instance_;
          }
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"GRU","");
          pvVar3 = (layer->name_).tagged_ptr_.ptr_;
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"reset gate recursion matrix","");
          validateGeneralWeightParams
                    (__return_storage_ptr__,(WeightParams *)puVar17,uVar15,local_58,&local_c8,
                     (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_a8);
          paVar11 = local_88;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          bVar5 = Result::good(__return_storage_ptr__);
          if (bVar5) {
            plVar8 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar8 != paVar11) {
              operator_delete(plVar8,paVar11->_M_allocated_capacity + 1);
            }
            puVar17 = (undefined1 *)(local_60.gru_)->outputgaterecursionmatrix_;
            if ((WeightParams *)puVar17 == (WeightParams *)0x0) {
              puVar17 = Specification::_WeightParams_default_instance_;
            }
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"GRU","");
            pvVar3 = (layer->name_).tagged_ptr_.ptr_;
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"output gate recursion matrix","");
            validateGeneralWeightParams
                      (__return_storage_ptr__,(WeightParams *)puVar17,uVar15,local_58,&local_c8,
                       (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_a8);
            paVar11 = local_88;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            bVar5 = Result::good(__return_storage_ptr__);
            if (bVar5) {
              plVar8 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar8 != paVar11) {
                operator_delete(plVar8,paVar11->_M_allocated_capacity + 1);
              }
              LVar19 = local_60;
              if (local_79 != '\0') {
                puVar17 = (undefined1 *)(local_60.gru_)->updategatebiasvector_;
                if ((WeightParams *)puVar17 == (WeightParams *)0x0) {
                  puVar17 = Specification::_WeightParams_default_instance_;
                }
                uVar15 = (local_60.gru_)->outputvectorsize_;
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"GRU","");
                pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_a8,"update gate bias vector","");
                validateGeneralWeightParams
                          (__return_storage_ptr__,(WeightParams *)puVar17,uVar15,1,&local_c8,
                           (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_a8);
                paVar11 = local_88;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                  operator_delete(local_a8._M_dataplus._M_p,
                                  local_a8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
                bVar5 = Result::good(__return_storage_ptr__);
                if (!bVar5) goto LAB_003414d1;
                plVar8 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar8 != paVar11) {
                  operator_delete(plVar8,paVar11->_M_allocated_capacity + 1);
                }
                puVar17 = (undefined1 *)(local_60.gru_)->resetgatebiasvector_;
                if ((WeightParams *)puVar17 == (WeightParams *)0x0) {
                  puVar17 = Specification::_WeightParams_default_instance_;
                }
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"GRU","");
                pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_a8,"reset gate bias vector","");
                validateGeneralWeightParams
                          (__return_storage_ptr__,(WeightParams *)puVar17,uVar15,1,&local_c8,
                           (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_a8);
                paVar11 = local_88;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                  operator_delete(local_a8._M_dataplus._M_p,
                                  local_a8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
                bVar5 = Result::good(__return_storage_ptr__);
                if (!bVar5) goto LAB_003414d1;
                plVar8 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar8 != paVar11) {
                  operator_delete(plVar8,paVar11->_M_allocated_capacity + 1);
                }
                puVar17 = (undefined1 *)(local_60.gru_)->outputgatebiasvector_;
                if ((WeightParams *)puVar17 == (WeightParams *)0x0) {
                  puVar17 = Specification::_WeightParams_default_instance_;
                }
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"GRU","");
                pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_a8,"output gate bias vector","");
                validateGeneralWeightParams
                          (__return_storage_ptr__,(WeightParams *)puVar17,uVar15,1,&local_c8,
                           (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                  operator_delete(local_a8._M_dataplus._M_p,
                                  local_a8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
                bVar5 = Result::good(__return_storage_ptr__);
                LVar19 = local_60;
                if (!bVar5) goto LAB_003414d1;
                plVar8 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar8 != paVar11) {
                  operator_delete(plVar8,paVar11->_M_allocated_capacity + 1);
                }
              }
              pIVar18 = &((LVar19.batchnorm_)->mean_->super_MessageLite)._internal_metadata_;
              if ((LVar19.batchnorm_)->mean_ == (WeightParams *)0x0) {
                pIVar18 = (InternalMetadata *)0x0;
              }
              lVar20 = (long)*(int *)&((LVar19.convolution_)->kernelsize_).arena_or_elements_;
              if (lVar20 != 0) {
                lVar16 = 0;
                do {
                  validateRecurrentActivationParams
                            (__return_storage_ptr__,
                             *(ActivationParams **)((long)&pIVar18->ptr_ + lVar16));
                  bVar5 = Result::good(__return_storage_ptr__);
                  if (!bVar5) goto LAB_003414d1;
                  plVar8 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar8 != paVar11) {
                    operator_delete(plVar8,paVar11->_M_allocated_capacity + 1);
                  }
                  lVar16 = lVar16 + 8;
                } while (lVar20 * 8 != lVar16);
              }
              Result::Result(__return_storage_ptr__);
            }
          }
        }
      }
    }
  }
LAB_003414d1:
  if (local_78.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_start != (WeightParamType *)0x0) {
    operator_delete(local_78.
                    super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateGRULayer(const Specification::NeuralNetworkLayer& layer) {
    // Must specify hidden states
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, 2));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "GRU", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "GRU", 5, 5, blobNameToRank));
    }

    const auto& params = layer.gru();
    bool hasBiasVectors = params.hasbiasvectors();

    std::vector<CoreML::WeightParamType> weightTypeList;
    weightTypeList.push_back(valueType(params.updategateweightmatrix()));
    weightTypeList.push_back(valueType(params.updategaterecursionmatrix()));
    weightTypeList.push_back(valueType(params.resetgateweightmatrix()));
    weightTypeList.push_back(valueType(params.resetgaterecursionmatrix()));
    weightTypeList.push_back(valueType(params.outputgateweightmatrix()));
    weightTypeList.push_back(valueType(params.outputgaterecursionmatrix()));
    if(hasBiasVectors){
        weightTypeList.push_back(valueType(params.updategatebiasvector()));
        weightTypeList.push_back(valueType(params.resetgatebiasvector()));
        weightTypeList.push_back(valueType(params.outputgatebiasvector()));
    }
    if(!isWeightParamTypeCompatible(weightTypeList)){
        const std::string err = "GRU layer '" + layer.name() + "' has invalid weight/recursion matrix or bias fields. "
        "Field value types should match and should be either half or full precision";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    // allen-continue


    // Check the size of the input matrices
    const uint64_t input_matrix_size = params.inputvectorsize() * params.outputvectorsize();
    const uint64_t outSize = params.outputvectorsize();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.updategateweightmatrix(), input_matrix_size,
                                                                  outSize, "GRU", layer.name(), "update gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.resetgateweightmatrix(), input_matrix_size,
                                                                  outSize, "GRU", layer.name(), "reset gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.outputgateweightmatrix(), input_matrix_size,
                                                                  outSize, "GRU", layer.name(), "output gate weight matrix"));

    // Check the size of the recurrent matrices
    const uint64_t recurrent_matrix_size = params.outputvectorsize() * params.outputvectorsize();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.updategaterecursionmatrix(), recurrent_matrix_size,
                                                                  outSize, "GRU", layer.name(), "update gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.resetgaterecursionmatrix(), recurrent_matrix_size,
                                                                  outSize, "GRU", layer.name(), "reset gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.outputgaterecursionmatrix(), recurrent_matrix_size,
                                                                  outSize, "GRU", layer.name(), "output gate recursion matrix"));

    if (hasBiasVectors){
        const uint64_t bias_size = params.outputvectorsize();
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.updategatebiasvector(), bias_size, 1,
                                                                      "GRU", layer.name(), "update gate bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.resetgatebiasvector(), bias_size, 1,
                                                                      "GRU", layer.name(), "reset gate bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.outputgatebiasvector(), bias_size, 1,
                                                                      "GRU", layer.name(), "output gate bias vector"));
    }

    // Now check the activations
    for (const auto& activation : params.activations()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRecurrentActivationParams(activation));
    }
    return Result();
}